

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

void StyleToHead(TidyDocImpl *doc,Node *head,Node *node,Bool fix,int indent)

{
  Node *pNVar1;
  Node *next;
  int indent_local;
  Bool fix_local;
  Node *node_local;
  Node *head_local;
  TidyDocImpl *doc_local;
  
  pNVar1 = node;
  while (_indent_local = pNVar1, _indent_local != (Node *)0x0) {
    pNVar1 = _indent_local->next;
    if (((_indent_local == (Node *)0x0) || (_indent_local->tag == (Dict *)0x0)) ||
       (_indent_local->tag->id != TidyTag_STYLE)) {
      if (_indent_local->content != (Node *)0x0) {
        StyleToHead(doc,head,_indent_local->content,fix,indent + 1);
      }
    }
    else if (fix == no) {
      prvTidyReport(doc,_indent_local,head,0x241);
    }
    else {
      prvTidyRemoveNode(_indent_local);
      prvTidyInsertNodeAtEnd(head,_indent_local);
      prvTidyReport(doc,_indent_local,head,0x263);
    }
  }
  return;
}

Assistant:

static void StyleToHead(TidyDocImpl* doc, Node *head, Node *node, Bool fix, int indent)
{
	Node *next;
	while (node)
	{
		next = node->next;	/* get 'next' now , in case the node is moved */
		/* dbg_show_node(doc, node, 0, indent); */
		if (nodeIsSTYLE(node))
		{
			if (fix)
			{
				TY_(RemoveNode)(node); /* unhook style node from body */
				TY_(InsertNodeAtEnd)(head, node);   /* add to end of head */
				TY_(Report)(doc, node, head, MOVED_STYLE_TO_HEAD); /* report move */
			}
			else
			{
				TY_(Report)(doc, node, head, FOUND_STYLE_IN_BODY);
			}
		}
		else if (node->content)
		{
			StyleToHead(doc, head, node->content, fix, indent + 1);
		}
		node = next;	/* process the 'next', if any */
	}
}